

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

Bool prvTidyConfigDiffThanDefault(TidyDocImpl *doc)

{
  Bool BVar1;
  TidyOptionValue *val;
  TidyOptionImpl *option;
  
  val = (doc->config).value;
  option = option_defs;
  BVar1 = no;
  while( true ) {
    option = option + 1;
    if (BVar1 != no) {
      return yes;
    }
    if (option->name == (ctmbstr)0x0) break;
    BVar1 = OptionValueEqDefault(option,val);
    BVar1 = BVar1 ^ yes;
    val = val + 1;
  }
  return no;
}

Assistant:

Bool  TY_(ConfigDiffThanDefault)( TidyDocImpl* doc )
{
  Bool diff = no;
  const TidyOptionImpl* option = option_defs + 1;
  const TidyOptionValue* val = doc->config.value;
  for ( /**/; !diff && option && option->name; ++option, ++val )
  {
      diff = !OptionValueEqDefault( option, val );
  }
  return diff;
}